

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O2

void __thiscall ON_DimStyle::SetMaskFrameType(ON_DimStyle *this,MaskFrame source)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined1 uVar3;
  undefined1 uVar5;
  undefined1 uVar7;
  undefined1 uVar9;
  undefined8 uVar10;
  ON_TextMask text_mask;
  undefined4 uVar4;
  undefined3 uVar6;
  undefined2 uVar8;
  
  text_mask.m_bDrawMask = (this->m_text_mask).m_bDrawMask;
  text_mask.m_mask_type = (this->m_text_mask).m_mask_type;
  text_mask.m_mask_frame = (this->m_text_mask).m_mask_frame;
  text_mask.m_reserved2 = (this->m_text_mask).m_reserved2;
  text_mask.m_mask_color.field_0 = (this->m_text_mask).m_mask_color.field_0;
  text_mask.m_mask_border = (this->m_text_mask).m_mask_border;
  uVar2 = (this->m_text_mask).m_reserved3;
  uVar3 = (this->m_text_mask).m_content_hash.m_digest[0];
  uVar5 = (this->m_text_mask).m_content_hash.m_digest[1];
  uVar7 = (this->m_text_mask).m_content_hash.m_digest[2];
  uVar9 = (this->m_text_mask).m_content_hash.m_digest[3];
  uVar8 = CONCAT11(uVar9,uVar7);
  uVar6 = CONCAT21(uVar8,uVar5);
  uVar4 = CONCAT31(uVar6,uVar3);
  uVar10 = *(undefined8 *)((this->m_text_mask).m_content_hash.m_digest + 4);
  uVar1 = *(undefined8 *)((this->m_text_mask).m_content_hash.m_digest + 0xc);
  text_mask.m_content_hash.m_digest._12_4_ = SUB84(uVar1,0);
  text_mask.m_content_hash.m_digest._16_4_ = SUB84((ulong)uVar1 >> 0x20,0);
  text_mask.m_content_hash.m_digest._4_4_ = SUB84(uVar10,0);
  text_mask.m_content_hash.m_digest._8_4_ = SUB84((ulong)uVar10 >> 0x20,0);
  text_mask.m_content_hash.m_digest._0_4_ = uVar4;
  if (text_mask.m_mask_frame != source) {
    text_mask.m_mask_frame = source;
    text_mask.m_content_hash.m_digest._0_4_ = ON_SHA1_Hash::ZeroDigest.m_digest._0_4_;
    text_mask.m_content_hash.m_digest._4_4_ = ON_SHA1_Hash::ZeroDigest.m_digest._4_4_;
    text_mask.m_content_hash.m_digest._8_4_ = ON_SHA1_Hash::ZeroDigest.m_digest._8_4_;
    text_mask.m_content_hash.m_digest._12_4_ = ON_SHA1_Hash::ZeroDigest.m_digest._12_4_;
    text_mask.m_content_hash.m_digest._16_4_ = ON_SHA1_Hash::ZeroDigest.m_digest._16_4_;
  }
  text_mask.m_reserved3 = uVar2;
  Internal_SetTextMask(this,&text_mask);
  Internal_SetOverrideDimStyleCandidateFieldOverride(this,MaskFrameType);
  return;
}

Assistant:

void ON_DimStyle::SetMaskFrameType(ON_TextMask::MaskFrame source)
{
  // This function is for legacy compatibility.
  // In October 2016, text mask information was moved from
  // a collection of individual values on ON_DimStyle to
  // an ON_TextMask class and a single ON_TextMask m_text_mask member
  // on ON_DimStyle.
  ON_TextMask text_mask = TextMask();
  text_mask.SetMaskFrameType(source);
  Internal_SetTextMask(text_mask);
  Internal_SetOverrideDimStyleCandidateFieldOverride(ON_DimStyle::field::MaskFrameType);
}